

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O1

deUint64 __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::renderBatched
          (DrawCallBatchingTest *this)

{
  bool bVar1;
  code *pcVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  long *plVar8;
  long *plVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar10;
  DrawCallBatchingTest *pDVar11;
  long lVar12;
  long lVar13;
  GLint location;
  vector<int,_std::allocator<int>_> dynamicAttributeLocations;
  ostringstream s;
  long *local_230;
  long local_220;
  undefined4 uStack_218;
  undefined4 uStack_214;
  long local_210;
  int local_204;
  long *local_200 [2];
  long local_1f0 [2];
  DrawCallBatchingTest *local_1e0;
  void *local_1d8;
  iterator iStack_1d0;
  int *local_1c8;
  deUint64 local_1b8;
  deUint64 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  long lVar7;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  local_1d8 = (void *)0x0;
  iStack_1d0._M_current = (int *)0x0;
  local_1c8 = (int *)0x0;
  (**(code **)(lVar7 + 0x1a00))(0,0,0x20,0x20);
  (**(code **)(lVar7 + 0x1680))((this->m_program->m_program).m_program);
  local_210 = lVar7;
  if (0 < (this->m_spec).staticAttributeCount) {
    local_1e0 = (DrawCallBatchingTest *)0x0;
    lVar12 = 0;
    do {
      pcVar2 = *(code **)(lVar7 + 0x780);
      dVar6 = (this->m_program->m_program).m_program;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,(int)lVar12);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_200,0,(char *)0x0,0x1c29d68);
      local_230 = &local_220;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_220 = *plVar9;
        uStack_218 = (undefined4)plVar8[3];
        uStack_214 = *(undefined4 *)((long)plVar8 + 0x1c);
      }
      else {
        local_220 = *plVar9;
        local_230 = (long *)*plVar8;
      }
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar4 = (*pcVar2)(dVar6,local_230);
      lVar7 = local_210;
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      pDVar11 = local_1e0;
      if (local_200[0] != local_1f0) {
        operator_delete(local_200[0],local_1f0[0] + 1);
      }
      (**(code **)(lVar7 + 0x610))(uVar4);
      if ((this->m_spec).useStaticBuffer == true) {
        (**(code **)(lVar7 + 0x40))
                  (0x8892,(this->m_batchedStaticBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar12]);
        (**(code **)(lVar7 + 0x19f0))(uVar4,4,0x1400,1,0,0);
        (**(code **)(lVar7 + 0x40))(0x8892,0);
      }
      else {
        (**(code **)(lVar7 + 0x19f0))
                  (uVar4,4,0x1400,1,0,
                   *(undefined8 *)
                    ((long)&(((this->m_staticAttributeDatas).
                              super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                            super__Vector_impl_data._M_start + (long)pDVar11));
      }
      lVar12 = lVar12 + 1;
      local_1e0 = (DrawCallBatchingTest *)((long)pDVar11 + 0x18);
    } while (lVar12 < (this->m_spec).staticAttributeCount);
  }
  local_1e0 = this;
  if (0 < (this->m_spec).dynamicAttributeCount) {
    iVar3 = 0;
    do {
      pcVar2 = *(code **)(local_210 + 0x780);
      dVar6 = (local_1e0->m_program->m_program).m_program;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_200,0,(char *)0x0,0x1c29d88);
      local_230 = &local_220;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_220 = *plVar9;
        uStack_218 = (undefined4)plVar8[3];
        uStack_214 = *(undefined4 *)((long)plVar8 + 0x1c);
      }
      else {
        local_220 = *plVar9;
        local_230 = (long *)*plVar8;
      }
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      iVar5 = (*pcVar2)(dVar6,local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_200[0] != local_1f0) {
        operator_delete(local_200[0],local_1f0[0] + 1);
      }
      local_204 = iVar5;
      (**(code **)(local_210 + 0x610))(iVar5);
      if (iStack_1d0._M_current == local_1c8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1d8,iStack_1d0,&local_204);
      }
      else {
        *iStack_1d0._M_current = local_204;
        iStack_1d0._M_current = iStack_1d0._M_current + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (local_1e0->m_spec).dynamicAttributeCount);
  }
  pDVar11 = local_1e0;
  lVar7 = local_210;
  if ((((local_1e0->m_spec).useDrawElements != false) &&
      ((local_1e0->m_spec).useIndexBuffer == true)) && ((local_1e0->m_spec).dynamicIndices == false)
     ) {
    (**(code **)(local_210 + 0x40))(0x8893,local_1e0->m_batchedStaticIndexBuffer);
  }
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Failed to setup initial state for rendering.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x2d2);
  (**(code **)(lVar7 + 0x648))();
  local_1b0 = deGetMicroseconds();
  if (0 < (pDVar11->m_spec).dynamicAttributeCount) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      if ((pDVar11->m_spec).useDynamicBuffer == true) {
        (**(code **)(lVar7 + 0x40))
                  (0x8892,(pDVar11->m_batchedDynamicBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar12]);
        (**(code **)(lVar7 + 0x19f0))(*(undefined4 *)((long)local_1d8 + lVar12 * 4),4,0x1400,1,0,0);
        (**(code **)(lVar7 + 0x40))(0x8892,0);
      }
      else {
        (**(code **)(lVar7 + 0x19f0))
                  (*(undefined4 *)((long)local_1d8 + lVar12 * 4),4,0x1400,1,0,
                   *(undefined8 *)
                    ((long)&(((pDVar11->m_dynamicAttributeDatas).
                              super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar13));
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x18;
    } while (lVar12 < (pDVar11->m_spec).dynamicAttributeCount);
  }
  if ((pDVar11->m_spec).useDrawElements == false) {
    (**(code **)(lVar7 + 0x538))
              (4,0,(pDVar11->m_spec).triangleCount * (pDVar11->m_spec).drawCallCount * 3);
  }
  else {
    bVar1 = (pDVar11->m_spec).dynamicIndices;
    if ((pDVar11->m_spec).useIndexBuffer == true) {
      if (bVar1 == false) {
        (**(code **)(lVar7 + 0x568))
                  (4,(pDVar11->m_spec).triangleCount * (pDVar11->m_spec).drawCallCount * 3,0x1401,0)
        ;
      }
      else {
        (**(code **)(lVar7 + 0x40))(0x8893,pDVar11->m_batchedDynamicIndexBuffer);
        (**(code **)(lVar7 + 0x568))
                  (4,(pDVar11->m_spec).triangleCount * (pDVar11->m_spec).drawCallCount * 3,0x1401,0)
        ;
        (**(code **)(lVar7 + 0x40))(0x8893,0);
      }
    }
    else {
      pvVar10 = &pDVar11->m_staticIndexData;
      if (bVar1 != false) {
        pvVar10 = &pDVar11->m_dynamicIndexData;
      }
      (**(code **)(lVar7 + 0x568))
                (4,(pDVar11->m_spec).triangleCount * (pDVar11->m_spec).drawCallCount * 3,0x1401,
                 (pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start);
    }
  }
  (**(code **)(lVar7 + 0x648))();
  local_1b8 = deGetMicroseconds();
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Batched rendering failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x300);
  (**(code **)(lVar7 + 0x40))(0x8893,0);
  if (0 < (pDVar11->m_spec).staticAttributeCount) {
    iVar3 = 0;
    do {
      pcVar2 = *(code **)(lVar7 + 0x780);
      dVar6 = (pDVar11->m_program->m_program).m_program;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_200,0,(char *)0x0,0x1c29d68);
      local_230 = &local_220;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_220 = *plVar9;
        uStack_218 = (undefined4)plVar8[3];
        uStack_214 = *(undefined4 *)((long)plVar8 + 0x1c);
      }
      else {
        local_220 = *plVar9;
        local_230 = (long *)*plVar8;
      }
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar4 = (*pcVar2)(dVar6,local_230);
      pDVar11 = local_1e0;
      lVar7 = local_210;
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_200[0] != local_1f0) {
        operator_delete(local_200[0],local_1f0[0] + 1);
      }
      (**(code **)(lVar7 + 0x518))(uVar4);
      iVar3 = iVar3 + 1;
    } while (iVar3 < (pDVar11->m_spec).staticAttributeCount);
  }
  if (0 < (pDVar11->m_spec).dynamicAttributeCount) {
    lVar12 = 0;
    do {
      (**(code **)(lVar7 + 0x518))(*(undefined4 *)((long)local_1d8 + lVar12 * 4));
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pDVar11->m_spec).dynamicAttributeCount);
  }
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Failed to reset state after batched rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x30d);
  if (local_1d8 != (void *)0x0) {
    operator_delete(local_1d8,(long)local_1c8 - (long)local_1d8);
  }
  return local_1b8 - local_1b0;
}

Assistant:

deUint64 DrawCallBatchingTest::renderBatched (void)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	deUint64				beginUs	= 0;
	deUint64				endUs	= 0;
	vector<GLint>			dynamicAttributeLocations;

	gl.viewport(0, 0, 32, 32);
	gl.useProgram(m_program->getProgram());

	// Setup static buffers
	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);

		if (m_spec.useStaticBuffer)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_batchedStaticBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, NULL);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		}
		else
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, &(m_staticAttributeDatas[attribNdx][0]));
	}

	// Get locations of dynamic attributes
	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_dyn" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);
		dynamicAttributeLocations.push_back(location);
	}

	if (m_spec.useDrawElements && m_spec.useIndexBuffer && !m_spec.dynamicIndices)
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_batchedStaticIndexBuffer);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup initial state for rendering.");

	gl.finish();

	beginUs = deGetMicroseconds();

	for (int attribute = 0; attribute < m_spec.dynamicAttributeCount; attribute++)
	{
		if (m_spec.useDynamicBuffer)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_batchedDynamicBuffers[attribute]);
			gl.vertexAttribPointer(dynamicAttributeLocations[attribute], 4, GL_BYTE, GL_TRUE, 0, NULL);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		}
		else
			gl.vertexAttribPointer(dynamicAttributeLocations[attribute], 4, GL_BYTE, GL_TRUE, 0, &(m_dynamicAttributeDatas[attribute][0]));
	}

	if (m_spec.useDrawElements)
	{
		if (m_spec.useIndexBuffer)
		{
			if (m_spec.dynamicIndices)
			{
				gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_batchedDynamicIndexBuffer);
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, NULL);
				gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
			}
			else
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, NULL);
		}
		else
		{
			if (m_spec.dynamicIndices)
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, &(m_dynamicIndexData[0]));
			else
				gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3 * m_spec.drawCallCount, GL_UNSIGNED_BYTE, &(m_staticIndexData[0]));
		}
	}
	else
		gl.drawArrays(GL_TRIANGLES, 0, 3 * m_spec.triangleCount * m_spec.drawCallCount);

	gl.finish();

	endUs = deGetMicroseconds();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Batched rendering failed");

	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());
		gl.disableVertexAttribArray(location);
	}

	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		gl.disableVertexAttribArray(dynamicAttributeLocations[attribNdx]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to reset state after batched rendering");

	return endUs - beginUs;
}